

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

TPZGeoElSide * __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_>::Father2
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_> *this,int side)

{
  int iVar1;
  TPZGeoEl *pTVar2;
  undefined4 in_EDX;
  TPZGeoElSide *in_RSI;
  TPZGeoEl *in_RDI;
  int fathsid;
  int son;
  TPZGeoEl *father;
  TPZGeoEl *gel;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  gel = in_RDI;
  pTVar2 = TPZGeoEl::Father(in_RDI);
  if (pTVar2 == (TPZGeoEl *)0x0) {
    TPZGeoElSide::TPZGeoElSide((TPZGeoElSide *)in_RDI);
  }
  else {
    iVar1 = TPZGeoEl::WhichSubel
                      ((TPZGeoEl *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    if (iVar1 < 0) {
      TPZGeoElSide::TPZGeoElSide((TPZGeoElSide *)in_RDI);
    }
    else {
      (**(code **)(*(long *)pTVar2 + 0x250))(pTVar2,in_EDX,iVar1);
      TPZGeoElSide::TPZGeoElSide(in_RSI,gel,(int)((ulong)in_RDI >> 0x20));
    }
  }
  return (TPZGeoElSide *)gel;
}

Assistant:

TPZGeoElSide
TPZGeoElRefLess<TGeo>::Father2(int side) const
{
	//std::cout << " Father2 teste Cedric: 08/05/2003\n";
	TPZGeoEl *father = Father();
	if(!father) return TPZGeoElSide();
	int son = WhichSubel();
	if(son<0) return TPZGeoElSide();
	int fathsid = father->FatherSide(side,son);
	return TPZGeoElSide(father,fathsid);
}